

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-app.cpp
# Opt level: O0

int __thiscall StateRecording::init(StateRecording *this,EVP_PKEY_CTX *ctx)

{
  StateRecording *extraout_RAX;
  Parameters *unaff_retaddr;
  AudioLogger *in_stack_00000008;
  Parameters parameters;
  Callback cbAudio;
  bool in_stack_ffffffffffffff4f;
  uint in_stack_ffffffffffffff50;
  undefined4 uVar1;
  function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
  *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  anon_class_8_1_8991fb9c local_30 [4];
  StateRecording *local_10;
  undefined1 local_1;
  
  if ((this->isStarted & 1U) == 0) {
    this->nKeysHave = 0;
    this->isStarted = true;
    uVar1 = 0;
    local_10 = this;
    std::atomic<bool>::operator=
              ((atomic<bool> *)(ulong)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(uVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4f);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(uVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4f);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(uVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4f);
    this->totalSize_bytes = 0;
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x173d6b);
    std::vector<short,_std::allocator<short>_>::clear
              ((vector<short,_std::allocator<short>_> *)0x173d7c);
    std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::clear
              ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)0x173d8d);
    std::
    function<void(std::vector<std::array<float,512ul>,std::allocator<std::array<float,512ul>>>const&)>
    ::function<StateRecording::init()::_lambda(auto:1_const&)_1_,void>
              (in_stack_ffffffffffffff60,local_30);
    AudioLogger::Parameters::Parameters((Parameters *)CONCAT44(uVar1,in_stack_ffffffffffffff50));
    std::
    function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
    ::operator=((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                 *)this,(function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                         *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    local_1 = AudioLogger::install(in_stack_00000008,unaff_retaddr);
    if (!(bool)local_1) {
      fprintf(_stderr,"Failed to install audio logger\n");
    }
    AudioLogger::Parameters::~Parameters((Parameters *)0x173e8d);
    std::
    function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
    ::~function((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                 *)0x173e9a);
    this = extraout_RAX;
  }
  else {
    local_1 = 0;
  }
  return (uint)CONCAT71((int7)((ulong)this >> 8),local_1) & 0xffffff01;
}

Assistant:

bool init() {
        if (isStarted) {
            return false;
        }

        nKeysHave = 0;
        isStarted = true;
        interrupt = false;
        doRecord = true;
        doneRecording = false;
        doneCutoffSearch = false;
        totalSize_bytes = 0;

        waveformF.clear();
        waveformI16.clear();
        keyPresses.clear();

        AudioLogger::Callback cbAudio = [&](const auto & frames) {
            const auto tStart = std::chrono::high_resolution_clock::now();

            {
                std::lock_guard lock(mutex);
                for (auto & frame : frames) {
                    waveformF.insert(waveformF.end(), frame.begin(), frame.end());
                }

                if (interrupt) {
                    doneRecording = true;
                    printf("\n[!] Recording interrupted\n");
                    return;
                }
                if (nKeysToCapture <= nKeysHave && !doneRecording) {
                    doneRecording = true;
                    printf("\n[+] Done recording\n");
                } else {
                    doRecord = true;
                }
            }

            const auto tEnd = std::chrono::high_resolution_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();

            if (tDiff > 3) {
                printf("[!] Audio callback took %ld ms\n", (long) tDiff);
            }
        };

        AudioLogger::Parameters parameters;
        parameters.callback = std::move(cbAudio);
        parameters.captureId = captureId;
        parameters.nChannels = nChannels;
        parameters.sampleRate = kSampleRate;
        parameters.filter = EAudioFilter::None;
        parameters.freqCutoff_Hz = kFreqCutoff_Hz;

        if (audioLogger.install(std::move(parameters)) == false) {
            fprintf(stderr, "Failed to install audio logger\n");
            return false;
        }

        return true;
    }